

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,QList<QString>>::emplace<QList<QString>const&>
          (QHash<QString,_QList<QString>_> *this,QString *key,QList<QString> *args)

{
  long lVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QString copy;
  QString *in_stack_ffffffffffffff68;
  QString *in_stack_ffffffffffffff70;
  QList<QString> *in_stack_ffffffffffffffc8;
  QString *in_stack_ffffffffffffffd0;
  QHash<QString,_QList<QString>_> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QHash<QString,_QList<QString>_> *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pVar2 = (piter)emplace<QList<QString>const&>
                           (this_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  QString::~QString((QString *)0x291bd5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }